

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void DumpFunction(Proto *f,TString *psource,DumpState *D)

{
  DumpState *D_local;
  TString *psource_local;
  Proto *f_local;
  
  if ((D->strip == 0) && (f->source != psource)) {
    DumpString(f->source,D);
  }
  else {
    DumpString((TString *)0x0,D);
  }
  DumpInt(f->linedefined,D);
  DumpInt(f->lastlinedefined,D);
  DumpByte((uint)f->numparams,D);
  DumpByte((uint)f->is_vararg,D);
  DumpByte((uint)f->maxstacksize,D);
  DumpCode(f,D);
  DumpConstants(f,D);
  DumpUpvalues(f,D);
  DumpProtos(f,D);
  DumpDebug(f,D);
  return;
}

Assistant:

static void DumpFunction (const Proto *f, TString *psource, DumpState *D) {
  if (D->strip || f->source == psource)
    DumpString(NULL, D);  /* no debug info or same source as its parent */
  else
    DumpString(f->source, D);
  DumpInt(f->linedefined, D);
  DumpInt(f->lastlinedefined, D);
  DumpByte(f->numparams, D);
  DumpByte(f->is_vararg, D);
  DumpByte(f->maxstacksize, D);
  DumpCode(f, D);
  DumpConstants(f, D);
  DumpUpvalues(f, D);
  DumpProtos(f, D);
  DumpDebug(f, D);
}